

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O1

void __thiscall
de::cmdline::detail::Parser::addOption<de::cmdline::TestBoolOpt>
          (Parser *this,Option<de::cmdline::TestBoolOpt> *option)

{
  pointer *ppOVar1;
  long lVar2;
  OptInfo *pOVar3;
  iterator __position;
  OptInfo opt;
  OptInfo local_58;
  
  local_58.setDefault = (SetDefaultFunc)0x0;
  local_58.shortName = option->shortName;
  local_58.longName = option->longName;
  local_58.description = option->description;
  local_58.defaultValue = option->defaultValue;
  local_58.namedValues = option->namedValues;
  local_58.isFlag = (NamedValue<bool> *)local_58.namedValues == (NamedValue<bool> *)0x0;
  local_58.parse = (GenericParseFunc)option->parse;
  local_58.namedValuesEnd = option->namedValuesEnd;
  local_58.namedValueStride = 0x10;
  local_58.dispatchParse = dispatchParse<de::cmdline::TestBoolOpt>;
  if ((NamedValue<bool> *)local_58.namedValues == (NamedValue<bool> *)0x0) {
    local_58.setDefault = dispatchSetDefault<de::cmdline::TestBoolOpt>;
  }
  __position._M_current =
       (this->m_options).
       super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_options).
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<de::cmdline::detail::Parser::OptInfo,std::allocator<de::cmdline::detail::Parser::OptInfo>>
    ::_M_realloc_insert<de::cmdline::detail::Parser::OptInfo_const&>
              ((vector<de::cmdline::detail::Parser::OptInfo,std::allocator<de::cmdline::detail::Parser::OptInfo>>
                *)this,__position,&local_58);
  }
  else {
    pOVar3 = &local_58;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      (__position._M_current)->shortName = pOVar3->shortName;
      pOVar3 = (OptInfo *)((long)pOVar3 + 8);
      __position._M_current = (OptInfo *)&(__position._M_current)->longName;
    }
    ppOVar1 = &(this->m_options).
               super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppOVar1 = *ppOVar1 + 1;
  }
  return;
}

Assistant:

void Parser::addOption (const Option<OptType>& option)
{
	OptInfo opt;

	opt.shortName			= option.shortName;
	opt.longName			= option.longName;
	opt.description			= option.description;
	opt.defaultValue		= option.defaultValue;
	opt.isFlag				= isBooleanOpt<OptType>() && !option.namedValues;
	opt.parse				= (GenericParseFunc)option.parse;
	opt.namedValues			= (const void*)option.namedValues;
	opt.namedValuesEnd		= (const void*)option.namedValuesEnd;
	opt.namedValueStride	= sizeof(*option.namedValues);
	opt.dispatchParse		= dispatchParse<OptType>;

	if (opt.isFlag)
		opt.setDefault		= dispatchSetDefault<OptType>;

	addOption(opt);
}